

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode Subscription_registerPublishJob(UA_Server *server,UA_Subscription *sub)

{
  UA_Job job_00;
  UA_StatusCode UVar1;
  undefined4 uStack_2c;
  UA_Job job;
  
  UVar1 = 0;
  if ((sub->publishJobIsRegistered == false) &&
     (job_00._4_4_ = uStack_2c, job_00.type = 4, job_00.job.closeConnection = (UA_Connection *)sub,
     job_00.job.methodCall.method = UA_Subscription_publishCallback,
     job_00.job._16_8_ = job.job._8_8_,
     UVar1 = UA_Server_addRepeatedJob
                       (server,job_00,(UA_UInt32)(long)sub->publishingInterval,&sub->publishJobGuid)
     , UVar1 == 0)) {
    sub->publishJobIsRegistered = true;
  }
  return UVar1;
}

Assistant:

UA_StatusCode
Subscription_registerPublishJob(UA_Server *server, UA_Subscription *sub) {
    if(sub->publishJobIsRegistered)
        return UA_STATUSCODE_GOOD;

    UA_LOG_DEBUG_SESSION(server->config.logger, sub->session,
                         "Subscription %u | Register subscription publishing callback",
                         sub->subscriptionID);
    UA_Job job;
    job.type = UA_JOBTYPE_METHODCALL;
    job.job.methodCall.method = (UA_ServerCallback)UA_Subscription_publishCallback;
    job.job.methodCall.data = sub;
    UA_StatusCode retval =
        UA_Server_addRepeatedJob(server, job, (UA_UInt32)sub->publishingInterval,
                                 &sub->publishJobGuid);
    if(retval == UA_STATUSCODE_GOOD)
        sub->publishJobIsRegistered = true;
    return retval;
}